

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commodore.cpp
# Opt level: O1

unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
__thiscall
Storage::Tape::Commodore::Parser::duplicate_match<Storage::Tape::Commodore::Header>
          (Parser *this,
          unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
          *first_copy,
          unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
          *second_copy)

{
  Header *pHVar1;
  Header *pHVar2;
  Header *pHVar3;
  void *__s1;
  void *__s2;
  int iVar4;
  unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
  *in_RCX;
  size_t __n;
  unique_ptr<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
  *puVar5;
  bool bVar6;
  
  pHVar1 = (second_copy->_M_t).
           super___uniq_ptr_impl<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
           ._M_t.
           super__Tuple_impl<0UL,_Storage::Tape::Commodore::Header_*,_std::default_delete<Storage::Tape::Commodore::Header>_>
           .super__Head_base<0UL,_Storage::Tape::Commodore::Header_*,_false>._M_head_impl;
  puVar5 = in_RCX;
  if ((pHVar1 != (Header *)0x0) &&
     (pHVar2 = (in_RCX->_M_t).
               super___uniq_ptr_impl<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
               ._M_t.
               super__Tuple_impl<0UL,_Storage::Tape::Commodore::Header_*,_std::default_delete<Storage::Tape::Commodore::Header>_>
               .super__Head_base<0UL,_Storage::Tape::Commodore::Header_*,_false>._M_head_impl,
     puVar5 = second_copy, pHVar2 != (Header *)0x0)) {
    if ((pHVar1->parity_was_valid == false) && (pHVar2->parity_was_valid != false)) {
      second_copy = in_RCX;
    }
    pHVar3 = (second_copy->_M_t).
             super___uniq_ptr_impl<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
             ._M_t.
             super__Tuple_impl<0UL,_Storage::Tape::Commodore::Header_*,_std::default_delete<Storage::Tape::Commodore::Header>_>
             .super__Head_base<0UL,_Storage::Tape::Commodore::Header_*,_false>._M_head_impl;
    pHVar3->duplicate_matched = true;
    __s1 = *(void **)&(pHVar1->data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
    __n = (long)*(pointer *)
                 ((long)&(pHVar1->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8) -
          (long)__s1;
    __s2 = *(void **)&(pHVar2->data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
    if (__n == (long)*(pointer *)
                      ((long)&(pHVar2->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 8)
               - (long)__s2) {
      iVar4 = bcmp(__s1,__s2,__n);
      bVar6 = iVar4 == 0;
    }
    else {
      bVar6 = false;
    }
    pHVar3->duplicate_matched = bVar6;
    puVar5 = second_copy;
  }
  (this->
  super_PulseClassificationParser<Storage::Tape::Commodore::WaveType,_Storage::Tape::Commodore::SymbolType>
  ).super_Parser<Storage::Tape::Commodore::SymbolType>._vptr_Parser =
       (_func_int **)
       (puVar5->_M_t).
       super___uniq_ptr_impl<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
       ._M_t.
       super__Tuple_impl<0UL,_Storage::Tape::Commodore::Header_*,_std::default_delete<Storage::Tape::Commodore::Header>_>
       .super__Head_base<0UL,_Storage::Tape::Commodore::Header_*,_false>._M_head_impl;
  (puVar5->_M_t).
  super___uniq_ptr_impl<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>_>
  ._M_t.
  super__Tuple_impl<0UL,_Storage::Tape::Commodore::Header_*,_std::default_delete<Storage::Tape::Commodore::Header>_>
  .super__Head_base<0UL,_Storage::Tape::Commodore::Header_*,_false>._M_head_impl = (Header *)0x0;
  return (__uniq_ptr_data<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>,_true,_true>
          )(__uniq_ptr_data<Storage::Tape::Commodore::Header,_std::default_delete<Storage::Tape::Commodore::Header>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ObjectType> Parser::duplicate_match(std::unique_ptr<ObjectType> first_copy, std::unique_ptr<ObjectType> second_copy) {
	// if only one copy was parsed successfully, return it
	if(!first_copy) return second_copy;
	if(!second_copy) return first_copy;

	// if no copies were second_copy, return nullptr
	if(!first_copy && !second_copy) return nullptr;

	// otherwise plan to return either one with a correct check digit, doing a comparison with the other
	std::unique_ptr<ObjectType> *copy_to_return = &first_copy;
	if(!first_copy->parity_was_valid && second_copy->parity_was_valid) copy_to_return = &second_copy;

	(*copy_to_return)->duplicate_matched = true;
	if(first_copy->data.size() != second_copy->data.size())
		(*copy_to_return)->duplicate_matched = false;
	else
		(*copy_to_return)->duplicate_matched = !(memcmp(&first_copy->data[0], &second_copy->data[0], first_copy->data.size()));

	return std::move(*copy_to_return);
}